

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,CallExpression *expression)

{
  undefined1 *puVar1;
  vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_> *pvVar2;
  Expression *pEVar3;
  pointer ppEVar4;
  pointer ppEVar5;
  ulong uVar6;
  
  pvVar2 = CallExpression::getArguments(expression);
  pEVar3 = CallExpression::getExpression(expression);
  (**(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar3,this);
  puVar1 = &this->field_0x20;
  std::operator<<((ostream *)puVar1,"(");
  ppEVar4 = (pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar5 = (pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar5 != ppEVar4) {
    uVar6 = 0;
    while( true ) {
      (**(ppEVar4[uVar6]->super_Statement).super_ASTNode._vptr_ASTNode)(ppEVar4[uVar6],this);
      if (((long)ppEVar5 - (long)ppEVar4 >> 3) - 1U <= uVar6) break;
      std::operator<<((ostream *)puVar1,", ");
      uVar6 = uVar6 + 1;
      ppEVar4 = (pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppEVar5 = (pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  std::operator<<((ostream *)puVar1,")");
  return;
}

Assistant:

void PrettyPrinter::visit(CallExpression* expression) {
    int i;
    std::vector<Expression*>& arguments = expression->getArguments();

    expression->getExpression()->accept(this);
    output << "(";

    if (arguments.size() > 0) {
        for (i = 0; i < arguments.size() - 1; ++i) {
            arguments[i]->accept(this);
            output << ", ";
        }

        arguments[i]->accept(this);
    }

    output << ")";
}